

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O0

int ImGuiStb::stb_text_locate_coord(ImGuiTextEditState *str,float x,float y)

{
  float line_start_idx;
  ImWchar IVar1;
  float fVar2;
  float w;
  int k;
  int i;
  float prev_x;
  float base_y;
  int n;
  StbTexteditRow r;
  float y_local;
  float x_local;
  ImGuiTextEditState *str_local;
  
  r.ymax = y;
  r.num_chars = (int)x;
  str_local._4_4_ = (float)STB_TEXTEDIT_STRINGLEN(str);
  i = 0;
  n = 0;
  base_y = 0.0;
  r.baseline_y_delta = 0.0;
  r.x1 = 0.0;
  r.ymin = 0.0;
  for (w = 0.0; line_start_idx = w, (int)w < (int)str_local._4_4_; w = (float)((int)r.ymin + (int)w)
      ) {
    STB_TEXTEDIT_LAYOUTROW((StbTexteditRow *)&base_y,str,(int)w);
    if ((int)r.ymin < 1) {
      return (int)str_local._4_4_;
    }
    if ((w == 0.0) && (r.ymax < (float)i + r.x1)) {
      return 0;
    }
    if (r.ymax < (float)i + r.baseline_y_delta) break;
    i = (int)(r.x0 + (float)i);
  }
  if ((int)w < (int)str_local._4_4_) {
    if (base_y <= (float)r.num_chars) {
      if ((float)r.num_chars < (float)n) {
        k = (int)base_y;
        for (w = 0.0; (int)w < (int)r.ymin; w = (float)((int)w + 1)) {
          fVar2 = STB_TEXTEDIT_GETWIDTH(str,(int)line_start_idx,(int)w);
          if ((float)r.num_chars < (float)k + fVar2) {
            if ((float)r.num_chars < (float)k + fVar2 / 2.0) {
              return (int)line_start_idx + (int)w;
            }
            return (int)line_start_idx + (int)w + 1;
          }
          k = (int)(fVar2 + (float)k);
        }
      }
      IVar1 = STB_TEXTEDIT_GETCHAR(str,(int)w + (int)r.ymin + -1);
      if (IVar1 == STB_TEXTEDIT_NEWLINE) {
        str_local._4_4_ = (float)((int)w + (int)r.ymin + -1);
      }
      else {
        str_local._4_4_ = (float)((int)w + (int)r.ymin);
      }
    }
    else {
      str_local._4_4_ = w;
    }
  }
  return (int)str_local._4_4_;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      k = i;
      prev_x = r.x0;
      for (i=0; i < r.num_chars; ++i) {
         float w = STB_TEXTEDIT_GETWIDTH(str, k, i);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}